

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

void initMatchList(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **oDep,Vec_Int_t **iMatch,
                  int *iLastItem,Vec_Int_t **oMatch,int *oLastItem,int *iGroup,int *oGroup,
                  int p_equivalence)

{
  int iVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t **temp;
  int local_40;
  int curr;
  int j;
  int i;
  Vec_Int_t **oMatch_local;
  int *iLastItem_local;
  Vec_Int_t **iMatch_local;
  Vec_Int_t **oDep_local;
  Vec_Int_t **iDep_local;
  Abc_Ntk_t *pNtk_local;
  
  if (p_equivalence == 0) {
    iVar1 = Abc_NtkPiNum(pNtk);
    pvVar2 = malloc((long)(iVar1 + 1) << 3);
    for (curr = 0; iVar1 = Abc_NtkPiNum(pNtk), curr < iVar1 + 1; curr = curr + 1) {
      pVVar3 = Vec_IntAlloc(0);
      *(Vec_Int_t **)((long)pvVar2 + (long)curr * 8) = pVVar3;
    }
    for (curr = 0; iVar1 = Abc_NtkPoNum(pNtk), curr < iVar1; curr = curr + 1) {
      iVar1 = Vec_IntSize(oDep[curr]);
      Vec_IntPush(*(Vec_Int_t **)((long)pvVar2 + (long)iVar1 * 8),curr);
    }
    temp._4_4_ = 0;
    for (curr = 0; iVar1 = Abc_NtkPiNum(pNtk), curr < iVar1 + 1; curr = curr + 1) {
      iVar1 = Vec_IntSize(*(Vec_Int_t **)((long)pvVar2 + (long)curr * 8));
      if (iVar1 == 0) {
        Vec_IntFree(*(Vec_Int_t **)((long)pvVar2 + (long)curr * 8));
      }
      else {
        oMatch[temp._4_4_] = *(Vec_Int_t **)((long)pvVar2 + (long)curr * 8);
        for (local_40 = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)((long)pvVar2 + (long)curr * 8)),
            local_40 < iVar1; local_40 = local_40 + 1) {
          iVar1 = Vec_IntEntry(oMatch[temp._4_4_],local_40);
          oGroup[iVar1] = temp._4_4_;
        }
        temp._4_4_ = temp._4_4_ + 1;
      }
    }
    *oLastItem = temp._4_4_;
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
    }
  }
  else {
    for (curr = 0; iVar1 = Abc_NtkPoNum(pNtk), curr < iVar1; curr = curr + 1) {
      Vec_IntPush(oMatch[curr],curr);
      oGroup[curr] = curr;
      iVar1 = Abc_NtkPoNum(pNtk);
      *oLastItem = iVar1;
    }
  }
  iVar1 = Abc_NtkPoNum(pNtk);
  pvVar2 = malloc((long)(iVar1 + 1) << 3);
  for (curr = 0; iVar1 = Abc_NtkPoNum(pNtk), curr < iVar1 + 1; curr = curr + 1) {
    pVVar3 = Vec_IntAlloc(0);
    *(Vec_Int_t **)((long)pvVar2 + (long)curr * 8) = pVVar3;
  }
  for (curr = 0; iVar1 = Abc_NtkPiNum(pNtk), curr < iVar1; curr = curr + 1) {
    iVar1 = Vec_IntSize(iDep[curr]);
    Vec_IntPush(*(Vec_Int_t **)((long)pvVar2 + (long)iVar1 * 8),curr);
  }
  temp._4_4_ = 0;
  for (curr = 0; iVar1 = Abc_NtkPoNum(pNtk), curr < iVar1 + 1; curr = curr + 1) {
    iVar1 = Vec_IntSize(*(Vec_Int_t **)((long)pvVar2 + (long)curr * 8));
    if (iVar1 == 0) {
      Vec_IntFree(*(Vec_Int_t **)((long)pvVar2 + (long)curr * 8));
    }
    else {
      iMatch[temp._4_4_] = *(Vec_Int_t **)((long)pvVar2 + (long)curr * 8);
      for (local_40 = 0; iVar1 = Vec_IntSize(iMatch[temp._4_4_]), local_40 < iVar1;
          local_40 = local_40 + 1) {
        iVar1 = Vec_IntEntry(iMatch[temp._4_4_],local_40);
        iGroup[iVar1] = temp._4_4_;
      }
      temp._4_4_ = temp._4_4_ + 1;
    }
  }
  *iLastItem = temp._4_4_;
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
  }
  return;
}

Assistant:

void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence)
{
    int i, j, curr;
    Vec_Int_t** temp;

    if(!p_equivalence) {
        temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPiNum(pNtk)+1);

        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)    
            temp[i] = Vec_IntAlloc( 0 );    

        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)        
            Vec_IntPush(temp[Vec_IntSize(oDep[i])], i);

        curr = 0;
        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)
        {
            if(Vec_IntSize(temp[i]) == 0)
                Vec_IntFree( temp[i] );

            else
            {
                oMatch[curr] = temp[i];
                
                for(j = 0; j < Vec_IntSize(temp[i]); j++)
                    oGroup[Vec_IntEntry(oMatch[curr], j)] = curr;
            
                curr++;
            }
        }

        *oLastItem = curr;

        ABC_FREE( temp );
    }
    else {
        // the else part fixes the outputs for P-equivalence checking
        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        {
            Vec_IntPush(oMatch[i], i);
            oGroup[i] = i;
            (*oLastItem) = Abc_NtkPoNum(pNtk);
        }
    }
        
    /*for(j = 0; j < *oLastItem; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        printf("%d: %d ", i, oGroup[i]);*/

    //////////////////////////////////////////////////////////////////////////////

    temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPoNum(pNtk)+1 );

    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)    
        temp[i] = Vec_IntAlloc( 0 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)        
        Vec_IntPush(temp[Vec_IntSize(iDep[i])], i);

    curr = 0;
    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)
    {
        if(Vec_IntSize(temp[i]) == 0)
            Vec_IntFree( temp[i] );
        else
        {
            iMatch[curr] = temp[i];
            for(j = 0; j < Vec_IntSize(iMatch[curr]); j++)
                iGroup[Vec_IntEntry(iMatch[curr], j)] = curr;
            curr++;
        }        
    }

    *iLastItem = curr;

    ABC_FREE( temp );        

    /*printf("\n");
    for(j = 0; j < *iLastItem; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
        printf("%d: %d ", i, iGroup[i]);
    printf("\n");*/
}